

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var __thiscall Js::JavascriptString::ToInteger(JavascriptString *this,int radix)

{
  LPCOLESTR pStrEnd;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int32 iVar5;
  undefined4 *puVar6;
  char16 *pStr;
  CharClassifier *this_00;
  OLECHAR *pOVar7;
  Var pvVar8;
  Type *pTVar9;
  uint64 uVar10;
  uint64 uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  LPCOLESTR pOVar15;
  double dVar16;
  undefined1 local_e0 [8];
  BigUInt bi;
  
  if (0x22 < radix - 2U && radix != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb95,"(radix == 0 || radix >= 2 && radix <= 36)",
                                "\'radix\' is invalid");
    if (!bVar3) goto LAB_00d1a6d8;
    *puVar6 = 0;
  }
  pStr = GetString(this);
  pStrEnd = pStr + this->m_charLength;
  this_00 = ScriptContext::GetCharClassifier
                      ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
  pOVar7 = CharClassifier::SkipWhiteSpace(this_00,pStr,pStrEnd);
  if (pOVar7 < pStrEnd) {
    bVar3 = false;
    bVar4 = false;
    if (*pOVar7 != L'+') {
      if (*pOVar7 != L'-') goto LAB_00d1a206;
      bVar4 = true;
    }
    bVar3 = bVar4;
    pOVar7 = pOVar7 + 1;
  }
  else {
    bVar3 = false;
  }
LAB_00d1a206:
  if (radix == 0) {
    if (((pStrEnd <= pOVar7) || (radix = 10, *pOVar7 == L'0')) &&
       (radix = 10, 2 < (long)pStrEnd - (long)pOVar7)) {
      if ((OLECHAR)(pOVar7[1] | 0x20U) == 0x78) {
        pOVar7 = pOVar7 + 2;
        radix = 0x10;
      }
      else {
        radix = 10;
      }
    }
LAB_00d1a31d:
    uVar14 = (ulong)(uint)radix;
  }
  else {
    if (radix == 0x10) {
      radix = 0x10;
      if (((2 < (long)pStrEnd - (long)pOVar7) && (*pOVar7 == L'0')) &&
         ((OLECHAR)(pOVar7[1] | 0x20U) == 0x78)) {
        pOVar7 = pOVar7 + 2;
      }
      goto LAB_00d1a31d;
    }
    uVar14 = (ulong)radix;
    if (0x25 < (uint)radix) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xbc2,
                                  "(radix <= (sizeof(*__countof_helper(maxUintStringLengthTable)) + 0))"
                                  ,"radix <= _countof(maxUintStringLengthTable)");
      if (!bVar4) goto LAB_00d1a6d8;
      *puVar6 = 0;
    }
  }
  if (pStrEnd < pOVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xbc3,"(pchEnd >= pch)","pchEnd >= pch");
    if (!bVar4) goto LAB_00d1a6d8;
    *puVar6 = 0;
  }
  if ((ulong)(byte)maxUintStringLengthTable[uVar14] < (ulong)((long)pStrEnd - (long)pOVar7 >> 1)) {
    BigUInt::BigUInt((BigUInt *)local_e0);
    pOVar15 = pOVar7;
    if (pOVar7 < pStrEnd) {
      while (((ulong)(ushort)*pOVar15 < 0x80 &&
             ((int)((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[(ushort)*pOVar15] &
                   0xffffU) < radix))) {
        bVar4 = BigUInt::FMulAdd((BigUInt *)local_e0,radix,
                                 (int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"
                                      [(ushort)*pOVar15] & 0xffffU);
        if (!bVar4) {
          JavascriptError::ThrowOutOfMemoryError
                    ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr);
        }
        iVar5 = BigUInt::Clu((BigUInt *)local_e0);
        if (0x20 < iVar5) {
          pJVar1 = (((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                   javascriptLibrary;
          if (bVar3) {
            pTVar9 = &(pJVar1->super_JavascriptLibraryBase).negativeInfinite;
          }
          else {
            pTVar9 = &(pJVar1->super_JavascriptLibraryBase).positiveInfinite;
          }
          goto LAB_00d1a559;
        }
        pOVar15 = pOVar15 + 1;
        if (pStrEnd <= pOVar15) break;
      }
    }
    if (pOVar7 == pOVar15) {
      pTVar9 = &(((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                    super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                 javascriptLibrary)->super_JavascriptLibraryBase).nan;
LAB_00d1a559:
      pvVar8 = pTVar9->ptr;
    }
    else {
      dVar16 = BigUInt::GetDbl((BigUInt *)local_e0);
      if (bVar3) {
        dVar16 = -dVar16;
      }
      pvVar8 = JavascriptNumber::ToVarIntCheck
                         (dVar16,(((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).
                                  ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    BigUInt::~BigUInt((BigUInt *)local_e0);
    return pvVar8;
  }
  uVar13 = 0;
  bi.m_rgluInit._112_8_ = pOVar7;
  if (pOVar7 < pStrEnd) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pOVar7 = (OLECHAR *)bi.m_rgluInit._112_8_;
    uVar12 = 0;
    do {
      uVar13 = uVar12;
      if ((0x7f < (ulong)(ushort)*pOVar7) ||
         (radix <= (int)((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[(ushort)*pOVar7] &
                        0xffffU))) break;
      uVar13 = ((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[(ushort)*pOVar7] & 0xffffU)
               + uVar12 * radix;
      if (uVar13 < uVar12) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xbd5,"(value >= beforeValue)","uint overflow");
        if (!bVar4) goto LAB_00d1a6d8;
        *puVar6 = 0;
      }
      pOVar7 = pOVar7 + 1;
      uVar12 = uVar13;
    } while (pOVar7 < pStrEnd);
  }
  if ((OLECHAR *)bi.m_rgluInit._112_8_ == pOVar7) {
    return (((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
            javascriptLibrary)->super_JavascriptLibraryBase).nan.ptr;
  }
  if (bVar3) {
    if (0 < (int)uVar13) {
      uVar13 = -uVar13;
LAB_00d1a579:
      return (Var)((ulong)uVar13 | 0x1000000000000);
    }
    dVar16 = (double)((ulong)(double)uVar13 | 0x8000000000000000);
    uVar10 = NumberUtilities::ToSpecial(dVar16);
    bVar3 = NumberUtilities::IsNan(dVar16);
    if (!bVar3) goto LAB_00d1a6ab;
    uVar11 = NumberUtilities::ToSpecial(dVar16);
  }
  else {
    if (-1 < (int)uVar13) goto LAB_00d1a579;
    dVar16 = (double)uVar13;
    uVar10 = NumberUtilities::ToSpecial(dVar16);
    bVar3 = NumberUtilities::IsNan(dVar16);
    if (!bVar3) goto LAB_00d1a6ab;
    uVar11 = NumberUtilities::ToSpecial(dVar16);
  }
  if ((uVar11 != 0xfff8000000000000) &&
     (uVar11 = NumberUtilities::ToSpecial(dVar16), uVar11 != 0x7ff8000000000000)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                ,0xa2,
                                "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                ,"We should only produce a NaN with this value");
    if (!bVar3) {
LAB_00d1a6d8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_00d1a6ab:
  return (Var)(uVar10 ^ 0xfffc000000000000);
}

Assistant:

Var JavascriptString::ToInteger(int radix)
    {
        AssertMsg(radix == 0 || radix >= 2 && radix <= 36, "'radix' is invalid");
        const char16* pchStart = GetString();
        const char16* pchEnd =  pchStart + m_charLength;
        const char16 *pch = this->GetScriptContext()->GetCharClassifier()->SkipWhiteSpace(pchStart, pchEnd);
        bool isNegative = false;

        if (pch < pchEnd)
        {
            switch (*pch)
            {
            case '-':
                isNegative = true;
                // Fall through.
            case '+':
                pch++;
                break;
            }
        }

        if (0 == radix)
        {
            if (pch < pchEnd && '0' != pch[0])
            {
                radix = 10;
            }
            else if (pchEnd - pch >= 2 && ('x' == pch[1] || 'X' == pch[1]))
            {
                radix = 16;
                pch += 2;
            }
            else
            {
                 // ES5's 'parseInt' does not allow treating a string beginning with a '0' as an octal value. ES3 does not specify a
                 // behavior
                 radix = 10;
            }
        }
        else if (16 == radix)
        {
            if(pchEnd - pch >= 2 && '0' == pch[0] && ('x' == pch[1] || 'X' == pch[1]))
            {
                pch += 2;
            }
        }

        Assert(radix <= _countof(maxUintStringLengthTable));
        Assert(pchEnd >= pch);
        size_t length = pchEnd - pch;
        const char16 *const pchMin = pch;
        __analysis_assume(radix < _countof(maxUintStringLengthTable));
        if(length <= maxUintStringLengthTable[radix])
        {
            // Use uint32 as integer being parsed - much faster than BigInt
            uint32 value = 0;
            for ( ; pch < pchEnd ; pch++)
            {
                char16 ch = *pch;

                if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
                {
                    break;
                }
                uint32 beforeValue = value;
                value = value * radix + ch;
                AssertMsg(value >= beforeValue, "uint overflow");
            }

            if(pchMin == pch)
            {
                return GetScriptContext()->GetLibrary()->GetNaN();
            }

            if(isNegative)
            {
                // negative zero can only be represented by doubles
                if(value <= INT_MAX && value != 0)
                {
                    int32 result = -((int32)value);
                    return JavascriptNumber::ToVar(result, this->GetScriptContext());
                }
                double result = -((double)(value));
                return JavascriptNumber::New(result, this->GetScriptContext());
            }
            return JavascriptNumber::ToVar(value, this->GetScriptContext());
        }

        BigUInt bi;
        for ( ; pch < pchEnd ; pch++)
        {
            char16 ch = *pch;

            if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
            {
                break;
            }
            if (!bi.FMulAdd(radix, ch))
            {
                //Mimic IE8 which threw an OutOfMemory exception in this case.
                JavascriptError::ThrowOutOfMemoryError(GetScriptContext());
            }
            // If we ever have more than 32 ulongs, the result must be infinite.
            if (bi.Clu() > 32)
            {
                Var result = isNegative ?
                    GetScriptContext()->GetLibrary()->GetNegativeInfinite() :
                    GetScriptContext()->GetLibrary()->GetPositiveInfinite();
                return result;
            }
        }

        if (pchMin == pch)
        {
            return GetScriptContext()->GetLibrary()->GetNaN();
        }

        // Convert to a double.
        double result = bi.GetDbl();
        if(isNegative)
        {
            result = -result;
        }

        return Js::JavascriptNumber::ToVarIntCheck(result, GetScriptContext());
    }